

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::setLayoutQualifier
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *id)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  EShLanguage EVar4;
  ulong uVar5;
  char *pcVar6;
  size_type sVar7;
  uint uVar8;
  char *pcVar9;
  _func_int *UNRECOVERED_JUMPTABLE;
  TBlendEquationShift be;
  TBlendEquationShift e;
  int *piVar10;
  
  sVar1 = id->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (id->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar7]);
      pcVar2[sVar7] = (char)iVar3;
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"column_major");
  if (iVar3 == 0) {
    uVar5 = (*(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff) + 0x2000000000000000;
LAB_004196a6:
    *(ulong *)&qualifier->field_0x8 = uVar5;
    return;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"row_major");
  if (iVar3 == 0) {
    uVar5 = *(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
    goto LAB_004196a6;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"push_constant");
  if (iVar3 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"push_constant");
    qualifier->layoutPushConstant = true;
    return;
  }
  EVar4 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((EVar4 & ~EShLangTessControl) == EShLangTessEvaluation) {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"triangles");
    if (iVar3 != 0) {
      EVar4 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar4 == EShLangTessEvaluation) {
        iVar3 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"triangles");
        if (((((iVar3 != 0) &&
              (iVar3 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       compare(id,"quads"), iVar3 != 0)) &&
             (iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"isolines"), iVar3 != 0)) &&
            ((iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"equal_spacing"), iVar3 != 0 &&
             (iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"fractional_even_spacing"), iVar3 != 0)))) &&
           ((iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"fractional_odd_spacing"), iVar3 != 0 &&
            ((iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"cw"), iVar3 != 0 &&
             (iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"ccw"), iVar3 != 0)))))) {
          pcVar9 = "point_mode";
          goto LAB_0041959b;
        }
      }
      else {
        if (EVar4 != EShLangGeometry) {
          __assert_fail("language == EShLangTessEvaluation",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                        ,0x1bfb,
                        "void glslang::HlslParseContext::setLayoutQualifier(const TSourceLoc &, TQualifier &, TString &)"
                       );
        }
        iVar3 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"points");
        if ((((iVar3 != 0) &&
             (iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"line_strip"), iVar3 != 0)) &&
            (iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"lines"), iVar3 != 0)) &&
           ((iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"lines_adjacency"), iVar3 != 0 &&
            (iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"triangles_adjacency"), iVar3 != 0)))) {
          pcVar9 = "triangle_strip";
LAB_0041959b:
          iVar3 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,pcVar9);
          if (iVar3 != 0) {
            EVar4 = (this->super_TParseContextBase).super_TParseVersions.language;
            goto LAB_004195af;
          }
        }
      }
    }
LAB_00419803:
    pcVar9 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
    pcVar6 = "ignored";
  }
  else {
LAB_004195af:
    if (EVar4 == EShLangFragment) {
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"origin_upper_left");
      if (((iVar3 == 0) ||
          (iVar3 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(id,"pixel_center_integer"), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,"early_fragment_tests"), iVar3 == 0)) goto LAB_00419803;
      uVar8 = 1;
      piVar10 = &DAT_0084f04c;
      do {
        pcVar9 = "none";
        if (uVar8 < 5) {
          pcVar9 = (char *)((long)&DAT_0084f04c + (long)*piVar10);
        }
        iVar3 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,pcVar9);
        if (iVar3 == 0) goto LAB_00419803;
        uVar8 = uVar8 + 1;
        piVar10 = piVar10 + 1;
      } while (uVar8 != 5);
      e = EBlendMultiply;
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,0,0xd,"blend_support");
      if (iVar3 == 0) {
        do {
          pcVar9 = TQualifier::getBlendEquationString(e);
          iVar3 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,pcVar9);
          if (iVar3 == 0) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,loc,1,&E_GL_KHR_blend_equation_advanced,"blend equation");
            piVar10 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                       blendEquations;
            *piVar10 = *piVar10 | 1 << ((byte)e & 0x1f);
            pcVar9 = (id->_M_dataplus)._M_p;
            UNRECOVERED_JUMPTABLE =
                 (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
            pcVar6 = "ignored";
            goto LAB_00419826;
          }
          e = e + EBlendScreen;
        } while (e != EBlendCount);
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar6 = "unknown blend equation";
        pcVar9 = "blend_support";
        goto LAB_00419826;
      }
    }
    pcVar9 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar6 = "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)";
  }
LAB_00419826:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar6,pcVar9,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::setLayoutQualifier(const TSourceLoc& loc, TQualifier& qualifier, TString& id)
{
    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == TQualifier::getLayoutMatrixString(ElmColumnMajor)) {
        qualifier.layoutMatrix = ElmRowMajor;
        return;
    }
    if (id == TQualifier::getLayoutMatrixString(ElmRowMajor)) {
        qualifier.layoutMatrix = ElmColumnMajor;
        return;
    }
    if (id == "push_constant") {
        requireVulkan(loc, "push_constant");
        qualifier.layoutPushConstant = true;
        return;
    }
    if (language == EShLangGeometry || language == EShLangTessEvaluation) {
        if (id == TQualifier::getGeometryString(ElgTriangles)) {
            // publicType.shaderQualifiers.geometry = ElgTriangles;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (language == EShLangGeometry) {
            if (id == TQualifier::getGeometryString(ElgPoints)) {
                // publicType.shaderQualifiers.geometry = ElgPoints;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLineStrip)) {
                // publicType.shaderQualifiers.geometry = ElgLineStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLines)) {
                // publicType.shaderQualifiers.geometry = ElgLines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLinesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgLinesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTrianglesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgTrianglesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTriangleStrip)) {
                // publicType.shaderQualifiers.geometry = ElgTriangleStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        } else {
            assert(language == EShLangTessEvaluation);

            // input primitive
            if (id == TQualifier::getGeometryString(ElgTriangles)) {
                // publicType.shaderQualifiers.geometry = ElgTriangles;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgQuads)) {
                // publicType.shaderQualifiers.geometry = ElgQuads;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgIsolines)) {
                // publicType.shaderQualifiers.geometry = ElgIsolines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // vertex spacing
            if (id == TQualifier::getVertexSpacingString(EvsEqual)) {
                // publicType.shaderQualifiers.spacing = EvsEqual;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalEven)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalEven;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalOdd)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalOdd;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // triangle order
            if (id == TQualifier::getVertexOrderString(EvoCw)) {
                // publicType.shaderQualifiers.order = EvoCw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexOrderString(EvoCcw)) {
                // publicType.shaderQualifiers.order = EvoCcw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // point mode
            if (id == "point_mode") {
                // publicType.shaderQualifiers.pointMode = true;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
    }
    if (language == EShLangFragment) {
        if (id == "origin_upper_left") {
            // publicType.shaderQualifiers.originUpperLeft = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "pixel_center_integer") {
            // publicType.shaderQualifiers.pixelCenterInteger = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "early_fragment_tests") {
            // publicType.shaderQualifiers.earlyFragmentTests = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        for (TLayoutDepth depth = (TLayoutDepth)(EldNone + 1); depth < EldCount; depth = (TLayoutDepth)(depth + 1)) {
            if (id == TQualifier::getLayoutDepthString(depth)) {
                // publicType.shaderQualifiers.layoutDepth = depth;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
        if (id.compare(0, 13, "blend_support") == 0) {
            bool found = false;
            for (TBlendEquationShift be = (TBlendEquationShift)0; be < EBlendCount; be = (TBlendEquationShift)(be + 1)) {
                if (id == TQualifier::getBlendEquationString(be)) {
                    requireExtensions(loc, 1, &E_GL_KHR_blend_equation_advanced, "blend equation");
                    intermediate.addBlendEquation(be);
                    // publicType.shaderQualifiers.blendEquation = true;
                    warn(loc, "ignored", id.c_str(), "");
                    found = true;
                    break;
                }
            }
            if (! found)
                error(loc, "unknown blend equation", "blend_support", "");
            return;
        }
    }
    error(loc, "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)", id.c_str(), "");
}